

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O2

Parse_ast * __thiscall
lambda::parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
          (Parse_ast *__return_storage_ptr__,void *this,Parse_ast *fst)

{
  int iVar1;
  int iVar2;
  Parse_error *this_00;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  *this_01;
  Call local_1c8;
  Call local_1b8;
  string local_1a0;
  Variable local_180;
  Shared_string local_160;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_148;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_118;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_e8;
  _Variadic_union<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_b8;
  undefined1 local_90;
  _Variadic_union<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_88;
  undefined1 local_60;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_50;
  
  parse_from::helper::eat_whitespace((helper *)this);
  iVar1 = std::istream::peek();
  if (iVar1 == -1) {
LAB_0010327b:
    std::__detail::__variant::
    _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
    ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)fst);
  }
  else {
    if (iVar1 == 0x28) {
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)&local_e8,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)fst);
      parse_from::helper::parse_term((Parse_ast *)&local_118,(helper *)this);
      Parse_ast::Call::Call(&local_1b8,(Parse_ast *)&local_e8,(Parse_ast *)&local_118);
      local_88._8_8_ = local_1b8.argument_;
      local_88._0_8_ = local_1b8.callee_;
      local_1b8.callee_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_1b8.argument_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_60 = 1;
      Parse_ast_(__return_storage_ptr__,this,(Parse_ast *)&local_88._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)&local_88._M_first);
      Parse_ast::Call::~Call(&local_1b8);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_118);
      this_01 = &local_e8;
    }
    else {
      if (iVar1 == 0x29) goto LAB_0010327b;
      if ((iVar1 == 0x2f) || (iVar1 == 0x5c)) {
        this_00 = (Parse_error *)__cxa_allocate_exception(0x20);
        ublib::Shared_string::Shared_string(&local_160,"attempted to define a lambda in a callee");
        Parse_error::Parse_error(this_00,&local_160);
        __cxa_throw(this_00,&Parse_error::typeinfo,Parse_error::~Parse_error);
      }
      iVar2 = isalpha(iVar1);
      if ((iVar1 != 0x5f) && (iVar2 == 0)) {
        parse_from::helper::unexpected_thing((helper *)this);
      }
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)&local_148,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)fst);
      parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_1a0,this);
      local_180.name_._M_dataplus._M_p = (pointer)&local_180.name_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p == &local_1a0.field_2) {
        local_180.name_.field_2._8_8_ = local_1a0.field_2._8_8_;
      }
      else {
        local_180.name_._M_dataplus._M_p = local_1a0._M_dataplus._M_p;
      }
      local_180.name_._M_string_length = local_1a0._M_string_length;
      local_1a0._M_string_length = 0;
      local_1a0.field_2._M_local_buf[0] = '\0';
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      std::variant<lambda::Parse_ast::Variable,lambda::Parse_ast::Call,lambda::Parse_ast::Lambda>::
      variant<lambda::Parse_ast::Variable,void,void,lambda::Parse_ast::Variable,void>
                ((variant<lambda::Parse_ast::Variable,lambda::Parse_ast::Call,lambda::Parse_ast::Lambda>
                  *)&local_50,&local_180);
      Parse_ast::Call::Call(&local_1c8,(Parse_ast *)&local_148,(Parse_ast *)&local_50);
      local_b8._8_8_ =
           local_1c8.argument_._M_t.
           super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
           super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
           super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
      local_b8._0_8_ =
           local_1c8.callee_._M_t.
           super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
           super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
           super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
      local_1c8.callee_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_1c8.argument_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_90 = 1;
      Parse_ast_(__return_storage_ptr__,this,(Parse_ast *)&local_b8._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)&local_b8._M_first);
      Parse_ast::Call::~Call(&local_1c8);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_50);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      this_01 = &local_148;
    }
    std::__detail::__variant::
    _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
    ::~_Variant_storage(this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

Parse_ast parse_app_list(Parse_ast fst) {
      eat_whitespace();
      auto ch = inp.peek();

      switch (ch) {
      case ')':
      case eof:
        return fst;
      case '(': {
        return parse_app_list(Parse_ast::Call(std::move(fst), parse_term()));
      }
      case '/':
      case '\\':
        throw Parse_error("attempted to define a lambda in a callee");
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(
              Parse_ast::Call(std::move(fst), Parse_ast::Variable(get_var())));
        } else {
          unexpected_thing();
        }
      }
    }